

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O1

void * list_wraper_packet(void *arg)

{
  MppPacket packet;
  RK_S32 RVar1;
  MPP_RET MVar2;
  MppMeta meta;
  MppFrame frm;
  MppFrame local_18;
  
  packet = *arg;
  RVar1 = mpp_packet_has_meta(packet);
  if (RVar1 != 0) {
    meta = mpp_packet_get_meta(packet);
    local_18 = (MppFrame)0x0;
    MVar2 = mpp_meta_get_frame(meta,KEY_INPUT_FRAME,&local_18);
    if (MVar2 == MPP_OK) {
      if (local_18 == (MppFrame)0x0) {
        _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"frm","list_wraper_packet",
                   0x3e);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
      mpp_frame_deinit(&local_18);
    }
  }
  mpp_packet_deinit((MppPacket *)arg);
  return (void *)0x0;
}

Assistant:

static void *list_wraper_packet(void *arg)
{
    MppPacket packet = *(MppPacket*)arg;

    if (mpp_packet_has_meta(packet)) {
        MppMeta meta = mpp_packet_get_meta(packet);
        MppFrame frm = NULL;

        if (MPP_OK == mpp_meta_get_frame(meta, KEY_INPUT_FRAME, &frm)) {
            mpp_assert(frm);
            mpp_frame_deinit(&frm);
        }
    }

    mpp_packet_deinit((MppPacket *)arg);
    return NULL;
}